

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_buffer.h
# Opt level: O1

Span<char> __thiscall absl::lts_20240722::CordBuffer::Rep::long_available(Rep *this)

{
  byte bVar1;
  CordRepFlat *pCVar2;
  size_t sVar3;
  sbyte sVar4;
  int iVar5;
  sbyte sVar6;
  int iVar7;
  Span<char> SVar8;
  
  if (((this->field_0).short_rep.raw_size & 1U) == 0) {
    pCVar2 = (this->field_0).long_rep.rep;
    bVar1 = (pCVar2->super_CordRep).tag;
    iVar5 = -0xb8000;
    if (bVar1 < 0xbb) {
      iVar5 = -0xe80;
    }
    sVar6 = 0xc;
    if (bVar1 < 0xbb) {
      sVar6 = 6;
    }
    iVar7 = -0x10;
    if (0x42 < bVar1) {
      iVar7 = iVar5;
    }
    sVar4 = 3;
    if (0x42 < bVar1) {
      sVar4 = sVar6;
    }
    sVar3 = (pCVar2->super_CordRep).length;
    SVar8.ptr_ = (pCVar2->super_CordRep).storage + sVar3;
    SVar8.len_ = (long)(int)(((uint)bVar1 << sVar4) + iVar7 + -0xd) - sVar3;
    return SVar8;
  }
  __assert_fail("!is_short()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/cord_buffer.h"
                ,0x153,"absl::Span<char> absl::CordBuffer::Rep::long_available() const");
}

Assistant:

bool is_short() const {
      constexpr size_t offset = offsetof(Short, raw_size);
      return (reinterpret_cast<const char*>(this)[offset] & 1) != 0;
    }